

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

Data * __thiscall
QTzTimeZonePrivate::data(Data *__return_storage_ptr__,QTzTimeZonePrivate *this,TimeType timeType)

{
  QTzTransitionRule *pQVar1;
  undefined4 uVar2;
  QTzTransitionRule *pQVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  difference_type __d;
  qint64 forMSecsSinceEpoch;
  ulong uVar10;
  QTzTransitionTime *pQVar11;
  long in_FS_OFFSET;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  QTzTransitionRule rule;
  undefined1 local_98 [40];
  int local_70;
  undefined1 local_68 [36];
  int iStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  forMSecsSinceEpoch = QDateTime::currentMSecsSinceEpoch();
  stack0xffffffffffffffb8 = &DAT_aaaaaaaaaaaaaaaa;
  iStack_40 = -0x55555556;
  uStack_3c = 0xaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  data((Data *)local_68,this,forMSecsSinceEpoch);
  if ((timeType == DaylightTime) == (iStack_40 == 0)) {
    nextTransition((Data *)local_98,this,forMSecsSinceEpoch);
    uVar9 = local_68._8_8_;
    uVar8 = local_68._0_8_;
    uVar7 = local_98._16_8_;
    uVar6 = local_98._0_8_;
    local_98._0_8_ = local_68._0_8_;
    local_68._0_8_ = uVar6;
    local_68._8_8_ = local_98._8_8_;
    local_98._8_8_ = uVar9;
    local_98._16_8_ = local_68._16_8_;
    local_68._16_8_ = uVar7;
    iStack_40 = local_70;
    local_68._24_8_ = local_98._24_8_;
    stack0xffffffffffffffb8 = (undefined1 *)local_98._32_8_;
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
      }
    }
    if (((undefined1 *)local_68._24_8_ != (undefined1 *)0x8000000000000000) &&
       ((timeType == DaylightTime) != (iStack_40 == 0))) goto LAB_0040a8e9;
    previousTransition((Data *)local_98,this,forMSecsSinceEpoch + 1);
    uVar9 = local_68._8_8_;
    uVar8 = local_68._0_8_;
    uVar7 = local_98._16_8_;
    uVar6 = local_98._0_8_;
    local_98._0_8_ = local_68._0_8_;
    local_68._0_8_ = uVar6;
    local_68._8_8_ = local_98._8_8_;
    local_98._8_8_ = uVar9;
    local_98._16_8_ = local_68._16_8_;
    local_68._16_8_ = uVar7;
    iStack_40 = local_70;
    local_68._24_8_ = local_98._24_8_;
    stack0xffffffffffffffb8 = (undefined1 *)local_98._32_8_;
    if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
      }
    }
    if ((undefined1 *)local_68._24_8_ != (undefined1 *)0x8000000000000000) {
      previousTransition((Data *)local_98,this,local_68._24_8_);
      uVar9 = local_68._8_8_;
      uVar8 = local_68._0_8_;
      uVar7 = local_98._16_8_;
      uVar6 = local_98._0_8_;
      local_98._0_8_ = local_68._0_8_;
      local_68._0_8_ = uVar6;
      local_68._8_8_ = local_98._8_8_;
      local_98._8_8_ = uVar9;
      local_98._16_8_ = local_68._16_8_;
      local_68._16_8_ = uVar7;
      iStack_40 = local_70;
      local_68._24_8_ = local_98._24_8_;
      stack0xffffffffffffffb8 = (undefined1 *)local_98._32_8_;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
    }
    if (((undefined1 *)local_68._24_8_ != (undefined1 *)0x8000000000000000) &&
       ((timeType == DaylightTime) != (iStack_40 == 0))) goto LAB_0040a8e9;
    pQVar11 = (this->cached_data).m_tranTimes.d.ptr;
    uVar10 = (this->cached_data).m_tranTimes.d.size;
    while (uVar5 = uVar10, 0 < (long)uVar5) {
      uVar10 = uVar5 >> 1;
      if (pQVar11[uVar10].atMSecsSinceEpoch <= forMSecsSinceEpoch) {
        pQVar11 = pQVar11 + uVar10 + 1;
        uVar10 = ~uVar10 + uVar5;
      }
    }
    do {
      if (pQVar11 == (this->cached_data).m_tranTimes.d.ptr) {
        (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
        (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
        (__return_storage_ptr__->abbreviation).d.size = 0;
        __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
        __return_storage_ptr__->offsetFromUtc = -0x80000000;
        __return_storage_ptr__->standardTimeOffset = -0x80000000;
        __return_storage_ptr__->daylightTimeOffset = -0x80000000;
        goto LAB_0040aa4e;
      }
      pQVar3 = (this->cached_data).m_tranRules.d.ptr;
      pQVar1 = pQVar3 + pQVar11[-1].ruleIndex;
      uVar2 = pQVar1->stdOffset;
      uVar4 = pQVar1->dstOffset;
      rule.dstOffset = uVar4;
      rule.stdOffset = uVar2;
      pQVar3 = pQVar3 + pQVar11[-1].ruleIndex;
      rule.abbreviationIndex = pQVar3->abbreviationIndex;
      rule._9_3_ = *(undefined3 *)&pQVar3->field_0x9;
      dataFromRule((Data *)local_98,this,rule,pQVar11[-1].atMSecsSinceEpoch);
      uVar9 = local_68._8_8_;
      uVar8 = local_68._0_8_;
      uVar7 = local_98._16_8_;
      uVar6 = local_98._0_8_;
      local_98._0_8_ = local_68._0_8_;
      local_68._0_8_ = uVar6;
      local_68._8_8_ = local_98._8_8_;
      local_98._8_8_ = uVar9;
      local_98._16_8_ = local_68._16_8_;
      local_68._16_8_ = uVar7;
      iStack_40 = local_70;
      local_68._24_8_ = local_98._24_8_;
      stack0xffffffffffffffb8 = (undefined1 *)local_98._32_8_;
      if ((QArrayData *)uVar8 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar8,2,0x10);
        }
      }
      pQVar11 = pQVar11 + -1;
    } while ((iStack_40 != 0) != (timeType == DaylightTime));
    uVar12 = local_68._0_4_;
    uVar13 = local_68._4_4_;
    uVar14 = local_68._8_4_;
    uVar15 = local_68._12_4_;
  }
  else {
LAB_0040a8e9:
    uVar12 = local_68._0_4_;
    uVar13 = local_68._4_4_;
    uVar14 = local_68._8_4_;
    uVar15 = local_68._12_4_;
  }
  uVar6 = local_68._16_8_;
  local_68._8_8_ = (char16_t *)0x0;
  local_68._0_8_ = (QArrayData *)0x0;
  *(undefined4 *)&(__return_storage_ptr__->abbreviation).d.d = uVar12;
  *(undefined4 *)((long)&(__return_storage_ptr__->abbreviation).d.d + 4) = uVar13;
  *(undefined4 *)&(__return_storage_ptr__->abbreviation).d.ptr = uVar14;
  *(undefined4 *)((long)&(__return_storage_ptr__->abbreviation).d.ptr + 4) = uVar15;
  local_68._16_8_ = (undefined1 *)0x0;
  (__return_storage_ptr__->abbreviation).d.size = uVar6;
  *(undefined4 *)&__return_storage_ptr__->atMSecsSinceEpoch = local_68._24_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->atMSecsSinceEpoch + 4) = local_68._28_4_;
  __return_storage_ptr__->offsetFromUtc = local_68._32_4_;
  __return_storage_ptr__->standardTimeOffset = iStack_44;
  __return_storage_ptr__->daylightTimeOffset = iStack_40;
LAB_0040aa4e:
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        return __return_storage_ptr__;
      }
      goto LAB_0040aafd;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0040aafd:
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::data(QTimeZone::TimeType timeType) const
{
    // True if tran is valid and has the DST-ness to match timeType:
    const auto validMatch = [timeType](const Data &tran) {
        return tran.atMSecsSinceEpoch != invalidMSecs()
            && ((timeType == QTimeZone::DaylightTime) != (tran.daylightTimeOffset == 0));
    };

    // Get current tran, use if suitable:
    const qint64 currentMSecs = QDateTime::currentMSecsSinceEpoch();
    Data tran = data(currentMSecs);
    if (validMatch(tran))
        return tran;

    // Otherwise, next tran probably flips DST-ness:
    tran = nextTransition(currentMSecs);
    if (validMatch(tran))
        return tran;

    // Failing that, prev (or present, if current MSecs is eactly a transition
    // moment) tran defines what data() got us and the one before that probably
    // flips DST-ness:
    tran = previousTransition(currentMSecs + 1);
    if (tran.atMSecsSinceEpoch != invalidMSecs())
        tran = previousTransition(tran.atMSecsSinceEpoch);
    if (validMatch(tran))
        return tran;

    // Otherwise, we can look backwards through transitions for a match; if we
    // have a POSIX rule, it clearly doesn't do DST (or we'd have hit it by
    // now), so we only need to look in the tranCache() up to now.
    const auto untilNow = [currentMSecs](QTzTransitionTime at) {
        return at.atMSecsSinceEpoch <= currentMSecs;
    };
    auto it = std::partition_point(tranCache().cbegin(), tranCache().cend(), untilNow);
    // That's the end or first future transition; we don't want to look at it,
    // but at all those before it.
    while (it != tranCache().cbegin()) {
        --it;
        tran = dataForTzTransition(*it);
        if ((timeType == QTimeZone::DaylightTime) != (tran.daylightTimeOffset == 0))
            return tran;
    }

    return {};
}